

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astSequenceNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  size_t sVar1;
  size_t local_b0;
  size_t i;
  size_t expressionCount;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  sysbvm_astSequenceNode_t **sequenceNode;
  anon_struct_40_5_36a2ec8c gcFrame;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  gcFrame.concretizeFunction = (sysbvm_tuple_t)(arguments + 1);
  memset(&sequenceNode,0,0x28);
  sequenceNode = (sysbvm_astSequenceNode_t **)0x2f;
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  expressionCount = 0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&expressionCount);
  sVar1 = sysbvm_array_getSize(*(sysbvm_tuple_t *)(*arguments + 0x30));
  for (local_b0 = 0; local_b0 < sVar1; local_b0 = local_b0 + 1) {
    gcFrame.result = sysbvm_array_at(*(sysbvm_tuple_t *)(*arguments + 0x30),local_b0);
    sequenceNode = (sysbvm_astSequenceNode_t **)
                   sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                             (context,gcFrame.result,*(sysbvm_tuple_t *)gcFrame.concretizeFunction);
    gcFrame.expression = sysbvm_tuple_getType(context,(sysbvm_tuple_t)sequenceNode);
    gcFrame.elementType = sysbvm_tuple_getType(context,gcFrame.expression);
    gcFrame.elementMetaType =
         sysbvm_type_getAnalyzeAndEvaluateConcreteMetaValueWithEnvironmentFunction
                   (context,gcFrame.elementType);
    if (gcFrame.elementMetaType != 0) {
      sequenceNode = (sysbvm_astSequenceNode_t **)
                     sysbvm_function_applyNoCheck3
                               (context,gcFrame.elementMetaType,gcFrame.expression,
                                (sysbvm_tuple_t)sequenceNode,
                                *(sysbvm_tuple_t *)gcFrame.concretizeFunction);
    }
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&expressionCount);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  return (sysbvm_tuple_t)sequenceNode;
}

Assistant:

static sysbvm_tuple_t sysbvm_astSequenceNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_tuple_t result;
        sysbvm_tuple_t expression;
        sysbvm_tuple_t elementType;
        sysbvm_tuple_t elementMetaType;
        sysbvm_tuple_t concretizeFunction;
    } gcFrame = {
        .result = SYSBVM_VOID_TUPLE
    };

    sysbvm_astSequenceNode_t **sequenceNode = (sysbvm_astSequenceNode_t**)node;

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*sequenceNode)->super.sourcePosition);

    size_t expressionCount = sysbvm_array_getSize((*sequenceNode)->expressions);
    for(size_t i = 0; i < expressionCount; ++i)
    {
        gcFrame.expression = sysbvm_array_at((*sequenceNode)->expressions, i);
        gcFrame.result = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, gcFrame.expression, *environment);
        
        gcFrame.elementType = sysbvm_tuple_getType(context, gcFrame.result);
        gcFrame.elementMetaType = sysbvm_tuple_getType(context, gcFrame.elementType);
        gcFrame.concretizeFunction = sysbvm_type_getAnalyzeAndEvaluateConcreteMetaValueWithEnvironmentFunction(context, gcFrame.elementMetaType);
        if(gcFrame.concretizeFunction)
            gcFrame.result = sysbvm_function_applyNoCheck3(context, gcFrame.concretizeFunction, gcFrame.elementType, gcFrame.result, *environment);
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}